

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesTemperatureSetConfig(zes_temp_handle_t hTemperature,zes_temp_config_t *pConfig)

{
  zes_pfnTemperatureSetConfig_t pfnSetConfig;
  ze_result_t result;
  zes_temp_config_t *pConfig_local;
  zes_temp_handle_t hTemperature_local;
  
  pfnSetConfig._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd60 != (code *)0x0) {
    pfnSetConfig._4_4_ = (*DAT_0011cd60)(hTemperature,pConfig);
  }
  return pfnSetConfig._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesTemperatureSetConfig(
        zes_temp_handle_t hTemperature,                 ///< [in] Handle for the component.
        const zes_temp_config_t* pConfig                ///< [in] New configuration.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetConfig = context.zesDdiTable.Temperature.pfnSetConfig;
        if( nullptr != pfnSetConfig )
        {
            result = pfnSetConfig( hTemperature, pConfig );
        }
        else
        {
            // generic implementation
        }

        return result;
    }